

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_unmark_neg_tet_relax(REF_SUBDIV ref_subdiv)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL again;
  REF_INT nmark;
  REF_INT nsweeps;
  REF_SUBDIV ref_subdiv_local;
  
  again = 0;
  ref_private_macro_code_rss_1 = 1;
  _nmark = ref_subdiv;
  while( true ) {
    if (ref_private_macro_code_rss_1 == 0) {
      uVar1 = ref_edge_ghost_int(_nmark->edge,_nmark->grid->mpi,_nmark->mark);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x34d,"ref_subdiv_unmark_neg_tet_relax",(ulong)uVar1,"ghost mark");
        return uVar1;
      }
      if (_nmark->instrument != 0) {
        uVar1 = ref_subdiv_mark_n(_nmark,&ref_private_macro_code_rss);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x350,"ref_subdiv_unmark_neg_tet_relax",(ulong)uVar1,"count");
          return uVar1;
        }
        if (_nmark->grid->mpi->id == 0) {
          printf(" %d edges marked after %d neg geom tet unmark relaxations\n",
                 (ulong)(uint)ref_private_macro_code_rss,(ulong)(uint)again);
        }
      }
      return 0;
    }
    again = again + 1;
    ref_private_macro_code_rss_1 = 0;
    uVar1 = ref_subdiv_unmark_relax(_nmark);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x334,"ref_subdiv_unmark_neg_tet_relax",(ulong)uVar1,"unmark relax inside neg tet");
      return uVar1;
    }
    uVar1 = ref_subdiv_unmark_neg_tet_geom_support(_nmark,&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x337,"ref_subdiv_unmark_neg_tet_relax",(ulong)uVar1,"neg geom");
      return uVar1;
    }
    uVar1 = ref_edge_ghost_min_int(_nmark->edge,_nmark->grid->mpi,_nmark->mark);
    if (uVar1 != 0) break;
    if (5 < again) {
      uVar1 = ref_subdiv_mark_n(_nmark,&ref_private_macro_code_rss);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x33f,"ref_subdiv_unmark_neg_tet_relax",(ulong)uVar1,"count");
        return uVar1;
      }
      if (_nmark->grid->mpi->id == 0) {
        printf(" %d edges marked after %d unmark neg geom tet relaxations\n",
               (ulong)(uint)ref_private_macro_code_rss,(ulong)(uint)again);
      }
    }
    if (again == 200) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x345,"ref_subdiv_unmark_neg_tet_relax",
             "too many unmark neg geom tet sweeps, stop inf loop");
      return 1;
    }
    uVar1 = ref_mpi_all_or(_nmark->grid->mpi,&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x347,"ref_subdiv_unmark_neg_tet_relax",(ulong)uVar1,"mpi all or");
      return uVar1;
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x33c,
         "ref_subdiv_unmark_neg_tet_relax",(ulong)uVar1,"ghost mark");
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_unmark_neg_tet_relax(
    REF_SUBDIV ref_subdiv) {
  REF_INT nsweeps, nmark;
  REF_BOOL again;

  nsweeps = 0;
  again = REF_TRUE;
  while (again) {
    nsweeps++;
    again = REF_FALSE;

    /* also makes consistent before/after */
    RSS(ref_subdiv_unmark_relax(ref_subdiv), "unmark relax inside neg tet");

    /* needs post sync for consistency */
    RSS(ref_subdiv_unmark_neg_tet_geom_support(ref_subdiv, &again), "neg geom");

    /* most conservative, unmark if any ghosts unmarked */
    RSS(ref_edge_ghost_min_int(ref_subdiv_edge(ref_subdiv),
                               ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
        "ghost mark");

    if (nsweeps > 5) {
      RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
      if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
        printf(" %d edges marked after %d unmark neg geom tet relaxations\n",
               nmark, nsweeps);
    }

    RUS(200, nsweeps, "too many unmark neg geom tet sweeps, stop inf loop");

    RSS(ref_mpi_all_or(ref_subdiv_mpi(ref_subdiv), &again), "mpi all or");
  }

  /* not be required but here for safety? */
  RSS(ref_edge_ghost_int(ref_subdiv_edge(ref_subdiv),
                         ref_subdiv_mpi(ref_subdiv), ref_subdiv->mark),
      "ghost mark");

  if (ref_subdiv->instrument) {
    RSS(ref_subdiv_mark_n(ref_subdiv, &nmark), "count");
    if (ref_mpi_once(ref_subdiv_mpi(ref_subdiv)))
      printf(" %d edges marked after %d neg geom tet unmark relaxations\n",
             nmark, nsweeps);
  }

  return REF_SUCCESS;
}